

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

MainFunc __thiscall kj::TestRunner::getMain(TestRunner *this)

{
  TestRunner *context;
  StringPtr extendedDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr briefDescription;
  StringPtr version;
  MainBuilder *pMVar1;
  Type *func;
  Type *func_00;
  Iface *extraout_RDX;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:202:44),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:202:44)>
  *in_RSI;
  MainFunc MVar2;
  undefined1 local_16a [2];
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:210:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:210:27)>
  local_168;
  Function<kj::MainBuilder::Validity_()> local_158;
  StringPtr local_148;
  undefined1 local_132 [2];
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:207:35),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:207:35)>
  local_130;
  Function<kj::MainBuilder::Validity_()> local_120;
  OptionName local_110;
  OptionName local_100;
  iterator local_f0;
  size_type local_e8;
  StringPtr local_e0;
  StringPtr local_d0;
  undefined1 local_ba [2];
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:202:44),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:202:44)>
  local_b8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_a8 [2];
  OptionName local_88;
  OptionName local_78;
  iterator local_68;
  size_type local_60;
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  MainBuilder local_28;
  TestRunner *this_local;
  
  context = in_RSI->t;
  this_local = this;
  StringPtr::StringPtr(&local_38,"KJ Test Runner (version not applicable)");
  StringPtr::StringPtr
            (&local_48,"Run all tests that have been linked into the binary with this test runner.")
  ;
  StringPtr::StringPtr(&local_58,(void *)0x0);
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  MainBuilder::MainBuilder
            (&local_28,(ProcessContext *)context,version,briefDescription,extendedDescription);
  MainBuilder::OptionName::OptionName(&local_88,'f');
  MainBuilder::OptionName::OptionName(&local_78,"filter");
  local_68 = &local_88;
  local_60 = 2;
  local_b8.t = (TestRunner *)
               _::
               boundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         (in_RSI,(_ *)(local_ba + 1),(TestRunner *)local_ba,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)local_a8,&local_b8);
  StringPtr::StringPtr(&local_d0,"<file>[:<line>]");
  StringPtr::StringPtr
            (&local_e0,
             "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
            );
  names_00._M_len = local_60;
  names_00._M_array = local_68;
  argumentTitle.content.size_ = local_d0.content.size_;
  argumentTitle.content.ptr = local_d0.content.ptr;
  func = (Type *)local_a8;
  helpText.content.size_ = local_e0.content.size_;
  helpText.content.ptr = local_e0.content.ptr;
  pMVar1 = MainBuilder::addOptionWithArg
                     (&local_28,names_00,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func
                      ,argumentTitle,helpText);
  MainBuilder::OptionName::OptionName(&local_110,'l');
  MainBuilder::OptionName::OptionName(&local_100,"list");
  local_f0 = &local_110;
  local_e8 = 2;
  local_130.t = (TestRunner *)
                _::
                boundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                          ((BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:207:35),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:207:35)>
                            *)in_RSI,(_ *)(local_132 + 1),(TestRunner *)local_132,func,
                           (Type *)local_d0.content.ptr);
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_120,&local_130);
  StringPtr::StringPtr
            (&local_148,
             "List all test cases that would run, but don\'t run them. If --filter is specified then only the match tests will be listed."
            );
  names._M_len = local_e8;
  names._M_array = local_f0;
  helpText_00.content.size_ = local_148.content.size_;
  helpText_00.content.ptr = local_148.content.ptr;
  func_00 = (Type *)&local_120;
  pMVar1 = MainBuilder::addOption
                     (pMVar1,names,(Function<kj::MainBuilder::Validity_()> *)func_00,helpText_00);
  local_168.t = (TestRunner *)
                _::
                boundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>
                          ((BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:210:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:210:27)>
                            *)in_RSI,(_ *)(local_16a + 1),(TestRunner *)local_16a,func_00,
                           (Type *)local_148.content.ptr);
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_158,&local_168);
  MainBuilder::callAfterParsing(pMVar1,&local_158);
  MainBuilder::build((MainBuilder *)this);
  Function<kj::MainBuilder::Validity_()>::~Function(&local_158);
  Function<kj::MainBuilder::Validity_()>::~Function(&local_120);
  Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(local_a8);
  MainBuilder::~MainBuilder(&local_28);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

MainFunc getMain() {
    return MainBuilder(context, "KJ Test Runner (version not applicable)",
        "Run all tests that have been linked into the binary with this test runner.")
        .addOptionWithArg({'f', "filter"}, KJ_BIND_METHOD(*this, setFilter), "<file>[:<line>]",
            "Run only the specified test case(s). You may use a '*' wildcard in <file>. You may "
            "also omit any prefix of <file>'s path; test from all matching files will run. "
            "You may specify multiple filters; any test matching at least one filter will run. "
            "<line> may be a range, e.g. \"100-500\".")
        .addOption({'l', "list"}, KJ_BIND_METHOD(*this, setList),
            "List all test cases that would run, but don't run them. If --filter is specified "
            "then only the match tests will be listed.")
        .callAfterParsing(KJ_BIND_METHOD(*this, run))
        .build();
  }